

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O0

unsigned_short __thiscall tchecker::vm_t::top<unsigned_short>(vm_t *this)

{
  long val_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  runtime_error *this_00;
  bytecode_t val;
  vm_t *this_local;
  
  sVar2 = std::vector<long,_std::allocator<long>_>::size(&this->_stack);
  if (sVar2 == 0) {
    __assert_fail("_stack.size() >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/vm/vm.hh"
                  ,0x222,"T tchecker::vm_t::top() [T = unsigned short]");
  }
  pvVar3 = std::vector<long,_std::allocator<long>_>::back(&this->_stack);
  val_00 = *pvVar3;
  bVar1 = contains_value<unsigned_short,long>(val_00);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"vm_t::top, value out-of-bounds");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (unsigned_short)val_00;
}

Assistant:

inline T top()
  {
    assert(_stack.size() >= 1);
    tchecker::bytecode_t const val = _stack.back();
    if (!contains_value<T>(val))
      throw std::runtime_error("vm_t::top, value out-of-bounds");
    return static_cast<T>(val);
  }